

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

bool __thiscall re2::PCRE::CheckRewriteString(PCRE *this,StringPiece *rewrite,string *error)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  
  pcVar2 = rewrite->ptr_;
  pcVar3 = pcVar2 + rewrite->length_;
  uVar1 = 0xffffffff;
  do {
    if (pcVar3 <= pcVar2) {
      if ((int)uVar1 >= 0) {
        SStringPrintf(error,
                      "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                      ,(ulong)uVar1,0xffffffffffffffff);
      }
      return (int)uVar1 < 0;
    }
    if (*pcVar2 == '\\') {
      pcVar2 = pcVar2 + 1;
      if (pcVar2 == pcVar3) {
LAB_00123de0:
        std::__cxx11::string::assign((char *)error);
        return false;
      }
      if (*pcVar2 != 0x5c) {
        uVar4 = (int)*pcVar2 - 0x30;
        if (9 < uVar4) goto LAB_00123de0;
        if ((int)uVar1 <= (int)uVar4) {
          uVar1 = uVar4;
        }
      }
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

int pcre_exec(const pcre*, const pcre_extra*, const char*, int, int, int, int*, int) {
  return 0;
}